

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

void __thiscall svm_example::~svm_example(svm_example *this)

{
  float *__ptr;
  flat_example *fec;
  
  __ptr = (this->krow)._begin;
  if (__ptr != (float *)0x0) {
    free(__ptr);
  }
  (this->krow)._begin = (float *)0x0;
  (this->krow)._end = (float *)0x0;
  (this->krow).end_array = (float *)0x0;
  fec = calloc_or_throw<flat_example>(1);
  memcpy(fec,&this->ex,200);
  free_flatten_example(fec);
  return;
}

Assistant:

svm_example::~svm_example()
{
  krow.delete_v();
  // free flatten example contents
  flat_example* fec = &calloc_or_throw<flat_example>();
  *fec = ex;
  free_flatten_example(fec);  // free contents of flat example and frees fec.
}